

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# telnet-proxy.c
# Opt level: O0

int main(int argc,char **argv)

{
  undefined8 uVar1;
  FILE *pFVar2;
  int iVar3;
  long lVar4;
  int *piVar5;
  char *pcVar6;
  ssize_t sVar7;
  undefined1 local_2c0 [8];
  addrinfo hints;
  addrinfo *ai;
  conn_t client;
  conn_t server;
  pollfd pfd [2];
  socklen_t addrlen;
  sockaddr_in addr;
  int rs;
  int listen_sock;
  short listen_port;
  char buffer [512];
  char **argv_local;
  int argc_local;
  
  buffer._504_8_ = argv;
  if (argc == 4) {
    lVar4 = strtol(argv[3],(char **)0x0,10);
    while (addr.sin_zero._4_4_ = socket(2,1,0), pFVar2 = _stderr, addr.sin_zero._4_4_ != -1) {
      addr.sin_zero[0] = '\x01';
      addr.sin_zero[1] = '\0';
      addr.sin_zero[2] = '\0';
      addr.sin_zero[3] = '\0';
      setsockopt(addr.sin_zero._4_4_,1,2,addr.sin_zero,4);
      memset(&pfd[1].events,0,0x10);
      pfd[1].events = 2;
      pfd[1].revents = htons((uint16_t)lVar4);
      iVar3 = bind(addr.sin_zero._4_4_,(sockaddr *)&pfd[1].events,0x10);
      pFVar2 = _stderr;
      if (iVar3 == -1) {
        piVar5 = __errno_location();
        pcVar6 = strerror(*piVar5);
        fprintf(pFVar2,"bind() failed: %s\n",pcVar6);
        close(addr.sin_zero._4_4_);
        return 1;
      }
      printf("LISTENING ON PORT %d\n",(ulong)(uint)(int)(short)(uint16_t)lVar4);
      iVar3 = listen(addr.sin_zero._4_4_,1);
      pFVar2 = _stderr;
      if (iVar3 == -1) {
        piVar5 = __errno_location();
        pcVar6 = strerror(*piVar5);
        fprintf(pFVar2,"listen() failed: %s\n",pcVar6);
        close(addr.sin_zero._4_4_);
        return 1;
      }
      pfd[1].fd = 0x10;
      client.name._0_4_ =
           accept(addr.sin_zero._4_4_,(sockaddr *)&pfd[1].events,(socklen_t *)(pfd + 1));
      pFVar2 = _stderr;
      if ((int)client.name == -1) {
        piVar5 = __errno_location();
        pcVar6 = strerror(*piVar5);
        fprintf(pFVar2,"accept() failed: %s\n",pcVar6);
        close(addr.sin_zero._4_4_);
        return 1;
      }
      printf("CLIENT CONNECTION RECEIVED\n");
      close(addr.sin_zero._4_4_);
      memset(local_2c0,0,0x30);
      local_2c0._4_4_ = 0;
      hints.ai_flags = 1;
      addr.sin_zero._0_4_ =
           getaddrinfo(*(char **)(buffer._504_8_ + 8),*(char **)(buffer._504_8_ + 0x10),
                       (addrinfo *)local_2c0,(addrinfo **)&hints.ai_next);
      pFVar2 = _stderr;
      if (addr.sin_zero._0_4_ != 0) {
        uVar1 = *(undefined8 *)(buffer._504_8_ + 8);
        pcVar6 = gai_strerror(addr.sin_zero._0_4_);
        fprintf(pFVar2,"getaddrinfo() failed for %s: %s\n",uVar1,pcVar6);
        close((int)client.name);
        return 1;
      }
      server.name._0_4_ = socket(2,1,0);
      pFVar2 = _stderr;
      if ((int)server.name == -1) {
        piVar5 = __errno_location();
        pcVar6 = strerror(*piVar5);
        fprintf(pFVar2,"socket() failed: %s\n",pcVar6);
        close((int)server.name);
        return 1;
      }
      memset(&pfd[1].events,0,0x10);
      pfd[1].events = 2;
      iVar3 = bind((int)server.name,(sockaddr *)&pfd[1].events,0x10);
      pFVar2 = _stderr;
      if (iVar3 == -1) {
        piVar5 = __errno_location();
        pcVar6 = strerror(*piVar5);
        fprintf(pFVar2,"bind() failed: %s\n",pcVar6);
        close((int)server.name);
        return 1;
      }
      iVar3 = connect((int)server.name,(sockaddr *)(hints.ai_next)->ai_addr,
                      (hints.ai_next)->ai_addrlen);
      pFVar2 = _stderr;
      if (iVar3 == -1) {
        piVar5 = __errno_location();
        pcVar6 = strerror(*piVar5);
        fprintf(pFVar2,"server() failed: %s\n",pcVar6);
        close((int)server.name);
        return 1;
      }
      freeaddrinfo((addrinfo *)hints.ai_next);
      printf("SERVER CONNECTION ESTABLISHED\n");
      client.remote = (conn_t *)anon_var_dwarf_ed;
      server.telnet = (telnet_t *)&ai;
      ai = (addrinfo *)anon_var_dwarf_104;
      client.telnet = (telnet_t *)&client.remote;
      server._8_8_ = telnet_init((telnet_telopt_t *)0x0,_event_handler,'\x01',&client.remote);
      client._8_8_ = telnet_init((telnet_telopt_t *)0x0,_event_handler,'\x01',&ai);
      memset(&server.remote,0,0x10);
      server.remote._0_4_ = (int)server.name;
      server.remote._4_2_ = 1;
      pfd[0].fd = (int)client.name;
      pfd[0].events = 1;
      while (iVar3 = poll((pollfd *)&server.remote,2,-1), iVar3 != -1) {
        if ((server.remote._6_2_ & 0x19) != 0) {
          sVar7 = recv((int)server.name,&listen_sock,0x200,0);
          addr.sin_zero._0_4_ = SUB84(sVar7,0);
          if ((int)addr.sin_zero._0_4_ < 1) {
            if (addr.sin_zero._0_4_ == 0) {
              printf("%s DISCONNECTED\n",client.remote);
              break;
            }
            piVar5 = __errno_location();
            if ((*piVar5 != 4) && (piVar5 = __errno_location(), pFVar2 = _stderr, *piVar5 != 0x68))
            {
              piVar5 = __errno_location();
              pcVar6 = strerror(*piVar5);
              fprintf(pFVar2,"recv(server) failed: %s\n",pcVar6);
              exit(1);
            }
          }
          else {
            telnet_recv((telnet_t *)server._8_8_,(char *)&listen_sock,(long)(int)addr.sin_zero._0_4_
                       );
          }
        }
        if ((pfd[0].revents & 0x19U) != 0) {
          sVar7 = recv((int)client.name,&listen_sock,0x200,0);
          addr.sin_zero._0_4_ = SUB84(sVar7,0);
          if ((int)addr.sin_zero._0_4_ < 1) {
            if (addr.sin_zero._0_4_ == 0) {
              printf("%s DISCONNECTED\n",ai);
              break;
            }
            piVar5 = __errno_location();
            if ((*piVar5 != 4) && (piVar5 = __errno_location(), pFVar2 = _stderr, *piVar5 != 0x68))
            {
              piVar5 = __errno_location();
              pcVar6 = strerror(*piVar5);
              fprintf(pFVar2,"recv(server) failed: %s\n",pcVar6);
              exit(1);
            }
          }
          else {
            telnet_recv((telnet_t *)client._8_8_,(char *)&listen_sock,(long)(int)addr.sin_zero._0_4_
                       );
          }
        }
      }
      telnet_free((telnet_t *)server._8_8_);
      telnet_free((telnet_t *)client._8_8_);
      close((int)server.name);
      close((int)client.name);
      printf("BOTH CONNECTIONS CLOSED\n");
    }
    piVar5 = __errno_location();
    pcVar6 = strerror(*piVar5);
    fprintf(pFVar2,"socket() failed: %s\n",pcVar6);
  }
  else {
    fprintf(_stderr,"Usage:\n ./telnet-proxy <remote ip> <remote port> <local port>\n");
  }
  return 1;
}

Assistant:

int main(int argc, char **argv) {
	char buffer[512];
	short listen_port;
	SOCKET listen_sock;
	int rs;
	struct sockaddr_in addr;
	socklen_t addrlen;
	struct pollfd pfd[2];
	struct conn_t server;
	struct conn_t client;
	struct addrinfo *ai;
	struct addrinfo hints;

	/* initialize Winsock */
#if defined(_WIN32)
	WSADATA wsd;
	WSAStartup(MAKEWORD(2, 2), &wsd);
#endif

	/* check usage */
	if (argc != 4) {
		fprintf(stderr, "Usage:\n ./telnet-proxy <remote ip> <remote port> "
				"<local port>\n");
		return 1;
	}

	/* parse listening port */
	listen_port = (short)strtol(argv[3], 0, 10);

	/* loop forever, until user kills process */
	for (;;) {
		/* create listening socket */
		if ((listen_sock = socket(AF_INET, SOCK_STREAM, 0)) == -1) {
			fprintf(stderr, "socket() failed: %s\n", strerror(errno));
			return 1;
		}

		/* reuse address option */
		rs = 1;
		setsockopt(listen_sock, SOL_SOCKET, SO_REUSEADDR, (char*)&rs, sizeof(rs));

		/* bind to listening addr/port */
		memset(&addr, 0, sizeof(addr));
		addr.sin_family = AF_INET;
		addr.sin_addr.s_addr = INADDR_ANY;
		addr.sin_port = htons(listen_port);
		if (bind(listen_sock, (struct sockaddr *)&addr, sizeof(addr)) == -1) {
			fprintf(stderr, "bind() failed: %s\n", strerror(errno));
			close(listen_sock);
			return 1;
		}

		printf("LISTENING ON PORT %d\n", listen_port);

		/* wait for client */
		if (listen(listen_sock, 1) == -1) {
			fprintf(stderr, "listen() failed: %s\n", strerror(errno));
			close(listen_sock);
			return 1;
		}
		addrlen = sizeof(addr);
		if ((client.sock = accept(listen_sock, (struct sockaddr *)&addr,
				&addrlen)) == -1) {
			fprintf(stderr, "accept() failed: %s\n", strerror(errno));
			close(listen_sock);
			return 1;
		}

		printf("CLIENT CONNECTION RECEIVED\n");

		/* stop listening now that we have a client */
		close(listen_sock);

		/* look up server host */
		memset(&hints, 0, sizeof(hints));
		hints.ai_family = AF_UNSPEC;
		hints.ai_socktype = SOCK_STREAM;
		if ((rs = getaddrinfo(argv[1], argv[2], &hints, &ai)) != 0) {
			fprintf(stderr, "getaddrinfo() failed for %s: %s\n", argv[1],
					gai_strerror(rs));
			close(client.sock);
			return 1;
		}

		/* create server socket */
		if ((server.sock = socket(AF_INET, SOCK_STREAM, 0)) == -1) {
			fprintf(stderr, "socket() failed: %s\n", strerror(errno));
			close(server.sock);
			return 1;
		}

		/* bind server socket */
		memset(&addr, 0, sizeof(addr));
		addr.sin_family = AF_INET;
		if (bind(server.sock, (struct sockaddr *)&addr, sizeof(addr)) == -1) {
			fprintf(stderr, "bind() failed: %s\n", strerror(errno));
			close(server.sock);
			return 1;
		}

		/* connect */
		if (connect(server.sock, ai->ai_addr, (int)ai->ai_addrlen) == -1) {
			fprintf(stderr, "server() failed: %s\n", strerror(errno));
			close(server.sock);
			return 1;
		}

		/* free address lookup info */
		freeaddrinfo(ai);

		printf("SERVER CONNECTION ESTABLISHED\n");

		/* initialize connection structs */
		server.name = COLOR_SERVER "SERVER";
		server.remote = &client;
		client.name = COLOR_CLIENT "CLIENT";
		client.remote = &server;

		/* initialize telnet boxes */
		server.telnet = telnet_init(0, _event_handler, TELNET_FLAG_PROXY,
				&server);
		client.telnet = telnet_init(0, _event_handler, TELNET_FLAG_PROXY,
				&client);

		/* initialize poll descriptors */
		memset(pfd, 0, sizeof(pfd));
		pfd[0].fd = server.sock;
		pfd[0].events = POLLIN;
		pfd[1].fd = client.sock;
		pfd[1].events = POLLIN;

		/* loop while both connections are open */
		while (poll(pfd, 2, -1) != -1) {
			/* read from server */
			if (pfd[0].revents & (POLLIN | POLLERR | POLLHUP)) {
				if ((rs = recv(server.sock, buffer, sizeof(buffer), 0)) > 0) {
					telnet_recv(server.telnet, buffer, rs);
				} else if (rs == 0) {
					printf("%s DISCONNECTED" COLOR_NORMAL "\n", server.name);
					break;
				} else {
					if (errno != EINTR && errno != ECONNRESET) {
						fprintf(stderr, "recv(server) failed: %s\n",
								strerror(errno));
						exit(1);
					}
				}
			}

			/* read from client */
			if (pfd[1].revents & (POLLIN | POLLERR | POLLHUP)) {
				if ((rs = recv(client.sock, buffer, sizeof(buffer), 0)) > 0) {
					telnet_recv(client.telnet, buffer, rs);
				} else if (rs == 0) {
					printf("%s DISCONNECTED" COLOR_NORMAL "\n", client.name);
					break;
				} else {
					if (errno != EINTR && errno != ECONNRESET) {
						fprintf(stderr, "recv(server) failed: %s\n",
								strerror(errno));
						exit(1);
					}
				}
			}
		}

		/* clean up */
		telnet_free(server.telnet);
		telnet_free(client.telnet);
		close(server.sock);
		close(client.sock);

		/* all done */
		printf("BOTH CONNECTIONS CLOSED\n");
	}

	/* not that we can reach this, but GCC will cry if it's not here */
	return 0;
}